

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

int IoCommandWriteTruth(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Ntk_t *pNtk;
  long *plVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  Vec_Int_t *vTruth;
  uint *Sign;
  FILE *__stream;
  char *pcVar5;
  uint fMsbFirst;
  
  pNtk = pAbc->pNtkCur;
  fMsbFirst = 0;
  Extra_UtilGetoptReset();
  bVar3 = true;
  while( true ) {
    while (iVar4 = Extra_UtilGetopt(argc,argv,"xrh"), iVar4 == 0x72) {
      fMsbFirst = fMsbFirst ^ 1;
    }
    if (iVar4 == -1) break;
    if (iVar4 != 0x78) goto LAB_008382d8;
    bVar3 = (bool)(bVar3 ^ 1);
  }
  if (pAbc->pNtkCur == (Abc_Ntk_t *)0x0) {
    pcVar5 = "Current network is not available.";
  }
  else if (pNtk->ntkType == ABC_NTK_LOGIC) {
    if (pNtk->vPos->nSize == 1) {
      if (pNtk->nObjCounts[7] == 1) {
        plVar1 = (long *)*pNtk->vPos->pArray;
        lVar2 = *(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8);
        if (*(int *)(lVar2 + 0x1c) == 0) {
          pcVar5 = "Can only write logic function with 0 inputs.";
        }
        else {
          if (*(int *)(lVar2 + 0x1c) < 0x11) {
            if (globalUtilOptind + 1 == argc) {
              pcVar5 = argv[globalUtilOptind];
              Abc_NtkToAig(pNtk);
              vTruth = (Vec_Int_t *)malloc(0x10);
              vTruth->nCap = 0;
              vTruth->nSize = 0;
              vTruth->pArray = (int *)0x0;
              Sign = Hop_ManConvertAigToTruth
                               ((Hop_Man_t *)pNtk->pManFunc,*(Hop_Obj_t **)(lVar2 + 0x38),
                                *(int *)(lVar2 + 0x1c),vTruth,fMsbFirst);
              __stream = fopen(pcVar5,"w");
              if (__stream != (FILE *)0x0) {
                if (bVar3) {
                  Extra_PrintHex2((FILE *)__stream,Sign,*(int *)(lVar2 + 0x1c));
                }
                else {
                  Extra_PrintBinary((FILE *)__stream,Sign,1 << ((byte)*(int *)(lVar2 + 0x1c) & 0x1f)
                                   );
                }
                fclose(__stream);
                Vec_IntFree(vTruth);
                return 0;
              }
              Vec_IntFree(vTruth);
              printf("Cannot open file \"%s\" for writing.\n",pcVar5);
              return 0;
            }
LAB_008382d8:
            fwrite("usage: write_truth [-xrh] <file>\n",0x21,1,(FILE *)pAbc->Err);
            fwrite("\t         writes truth table into a file\n",0x29,1,(FILE *)pAbc->Err);
            pcVar5 = "hex";
            if (!bVar3) {
              pcVar5 = "bin";
            }
            fprintf((FILE *)pAbc->Err,
                    "\t-x     : toggles between bin and hex representation [default = %s]\n",pcVar5)
            ;
            pcVar5 = "yes";
            if (fMsbFirst == 0) {
              pcVar5 = "no";
            }
            fprintf((FILE *)pAbc->Err,
                    "\t-r     : toggle reversing bits in the truth table [default = %s]\n",pcVar5);
            fwrite("\t-h     : print the help massage\n",0x21,1,(FILE *)pAbc->Err);
            fwrite("\tfile   : the name of the file to write\n",0x28,1,(FILE *)pAbc->Err);
            return 1;
          }
          pcVar5 = "Can only write logic function with no more than 16 inputs.";
        }
      }
      else {
        pcVar5 = "Current network should have exactly one node.";
      }
    }
    else {
      pcVar5 = "Current network should have exactly one primary output.";
    }
  }
  else {
    pcVar5 = "Current network should not an AIG. Run \"logic\".";
  }
  puts(pcVar5);
  return 0;
}

Assistant:

int IoCommandWriteTruth( Abc_Frame_t * pAbc, int argc, char **argv )
{
    Vec_Int_t * vTruth;
    Abc_Ntk_t * pNtk = pAbc->pNtkCur;
    Abc_Obj_t * pNode;
    char * pFileName;
    FILE * pFile;
    unsigned * pTruth;
    int fHex = 1;
    int fReverse = 0;
    int c;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "xrh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'x':
                fHex ^= 1;
                break;
            case 'r':
                fReverse ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pAbc->pNtkCur == NULL )
    {
        printf( "Current network is not available.\n" );
        return 0;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        printf( "Current network should not an AIG. Run \"logic\".\n" );
        return 0;
    }
    if ( Abc_NtkPoNum(pNtk) != 1 )
    {
        printf( "Current network should have exactly one primary output.\n" );
        return 0;
    }
    if ( Abc_NtkNodeNum(pNtk) != 1 )
    {
        printf( "Current network should have exactly one node.\n" );
        return 0;
    }
    pNode = Abc_ObjFanin0( Abc_NtkPo(pNtk, 0) );
    if ( Abc_ObjFaninNum(pNode) == 0 )
    { 
        printf( "Can only write logic function with 0 inputs.\n" );
        return 0;
    }
    if ( Abc_ObjFaninNum(pNode) > 16 )
    { 
        printf( "Can only write logic function with no more than 16 inputs.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pFileName = argv[globalUtilOptind];
    // convert to logic
    Abc_NtkToAig( pNtk );
    vTruth = Vec_IntAlloc( 0 );
    pTruth = Hop_ManConvertAigToTruth( (Hop_Man_t *)pNtk->pManFunc, (Hop_Obj_t *)pNode->pData, Abc_ObjFaninNum(pNode), vTruth, fReverse );
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        Vec_IntFree( vTruth );
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return 0;
    }
    if ( fHex )
        Extra_PrintHex2( pFile, pTruth, Abc_ObjFaninNum(pNode) );
    else
        Extra_PrintBinary( pFile, pTruth, 1<<Abc_ObjFaninNum(pNode) );
    fclose( pFile );
    Vec_IntFree( vTruth );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_truth [-xrh] <file>\n" );
    fprintf( pAbc->Err, "\t         writes truth table into a file\n" );
    fprintf( pAbc->Err, "\t-x     : toggles between bin and hex representation [default = %s]\n", fHex?  "hex":"bin" );
    fprintf( pAbc->Err, "\t-r     : toggle reversing bits in the truth table [default = %s]\n", fReverse? "yes":"no" );
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\tfile   : the name of the file to write\n" );
    return 1;
}